

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luac.c
# Opt level: O0

void PrintFunction(Proto *f,int full)

{
  int iVar1;
  int local_18;
  int n;
  int i;
  int full_local;
  Proto *f_local;
  
  iVar1 = f->sizep;
  PrintHeader(f);
  PrintCode(f);
  if (full != 0) {
    PrintDebug(f);
  }
  for (local_18 = 0; local_18 < iVar1; local_18 = local_18 + 1) {
    PrintFunction(f->p[local_18],full);
  }
  return;
}

Assistant:

static void PrintFunction(const Proto *f, int full) {
    int i, n = f->sizep;
    PrintHeader(f);
    PrintCode(f);
    if (full) PrintDebug(f);
    for (i = 0; i < n; i++) PrintFunction(f->p[i], full);
}